

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O0

void __thiscall deqp::gles2::Stress::anon_unknown_0::OutputCase::testFBO(OutputCase *this)

{
  allocator<unsigned_short> *this_00;
  code *pcVar1;
  short sVar2;
  int iVar3;
  deUint32 dVar4;
  reference pvVar5;
  reference pvVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  float fVar10;
  float fVar11;
  TextureLevel *local_ab8;
  int local_a9c;
  allocator<char> local_9f1;
  string local_9f0;
  allocator<char> local_9c9;
  string local_9c8;
  LogImage local_9a8;
  ConstPixelBufferAccess local_918;
  allocator<char> local_8e9;
  string local_8e8;
  allocator<char> local_8c1;
  string local_8c0;
  LogImage local_8a0;
  ConstPixelBufferAccess local_810;
  allocator<char> local_7e1;
  string local_7e0;
  allocator<char> local_7b9;
  string local_7b8;
  LogImage local_798;
  allocator<char> local_701;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  LogImageSet local_6b8;
  MessageBuilder local_678;
  deUint32 local_4f8;
  int local_4f4;
  PixelBufferAccess local_4f0;
  undefined1 local_4c8 [8];
  Vec4 cSpecial;
  undefined1 local_48c [8];
  Vec4 cNormal;
  float greenThreshold;
  int x;
  int y_3;
  int local_2ec;
  RGBA local_2e8;
  int badPixels;
  RGBA okPixelColor;
  RGBA badPixelColor;
  Surface errorMask;
  int local_298;
  int indexIndex;
  deUint32 uniformValue;
  deUint32 special;
  deUint32 one;
  int y_2;
  MessageBuilder local_280;
  byte local_fd;
  int local_fc;
  undefined4 uStack_f8;
  bool specialPass;
  int passNdx;
  GLint specialLoc;
  GLint positionLoc;
  Functions *gl;
  int baseNdx;
  int y_1;
  float local_d8 [2];
  Vector<float,_4> local_d0;
  float local_c0;
  int local_bc;
  float posY;
  int y;
  TextureLevel normalImage;
  TextureLevel specialImage;
  TextureFormat textureFormat;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  allocator<tcu::Vector<float,_4>_> local_29;
  undefined1 local_28 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> gridVertices;
  OutputCase *this_local;
  
  gridVertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_29);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_28,0x2e
             ,&local_29);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_29);
  this_00 = (allocator<unsigned_short> *)((long)&textureFormat.order + 3);
  std::allocator<unsigned_short>::allocator(this_00);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&textureFormat.type,0x84,
             this_00);
  std::allocator<unsigned_short>::~allocator
            ((allocator<unsigned_short> *)((long)&textureFormat.order + 3));
  tcu::TextureFormat::TextureFormat
            ((TextureFormat *)((long)&specialImage.m_data.m_cap + 4),RGBA,
             (uint)(*(int *)&(this->super_FramebufferRenderCase).super_RenderCase.field_0x84 == 5)
             << 5 | UNORM_INT8);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&normalImage.m_data.m_cap,
             (TextureFormat *)((long)&specialImage.m_data.m_cap + 4),0x100,0x100,1);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&posY,(TextureFormat *)((long)&specialImage.m_data.m_cap + 4),0x100,
             0x100,1);
  for (local_bc = 0; local_bc < 0x17; local_bc = local_bc + 1) {
    local_c0 = (float)local_bc / 22.0 + (float)local_bc / 22.0 + -1.0;
    tcu::Vector<float,_4>::Vector(&local_d0,-1.0,local_c0,0.0,1.0);
    pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_28,(long)(local_bc * 2));
    *(undefined8 *)pvVar5->m_data = local_d0.m_data._0_8_;
    *(undefined8 *)(pvVar5->m_data + 2) = local_d0.m_data._8_8_;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&baseNdx,1.0,local_c0,0.0,1.0);
    pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_28,(long)(local_bc * 2 + 1));
    *(undefined8 *)pvVar5->m_data = _baseNdx;
    *(float (*) [2])(pvVar5->m_data + 2) = local_d8;
  }
  for (gl._4_4_ = 0; gl._4_4_ < 0x16; gl._4_4_ = gl._4_4_ + 1) {
    gl._0_4_ = gl._4_4_ * 6;
    iVar3 = gl._4_4_ << 1;
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                        &textureFormat.type,(long)(int)gl);
    *pvVar6 = (value_type)iVar3;
    sVar2 = (short)gl._4_4_;
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                        &textureFormat.type,(long)((int)gl + 1));
    *pvVar6 = (sVar2 + 1) * 2;
    sVar2 = (short)gl._4_4_;
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                        &textureFormat.type,(long)((int)gl + 2));
    *pvVar6 = (sVar2 + 1) * 2 + 1;
    iVar3 = gl._4_4_ << 1;
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                        &textureFormat.type,(long)((int)gl + 3));
    *pvVar6 = (value_type)iVar3;
    sVar2 = (short)gl._4_4_;
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                        &textureFormat.type,(long)((int)gl + 4));
    *pvVar6 = (sVar2 + 1) * 2 + 1;
    iVar3 = gl._4_4_ << 1;
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                        &textureFormat.type,(long)((int)gl + 5));
    *pvVar6 = (short)iVar3 + 1;
  }
  pRVar7 = gles2::Context::getRenderContext
                     ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.m_context)
  ;
  iVar3 = (*pRVar7->_vptr_RenderContext[3])();
  _specialLoc = CONCAT44(extraout_var,iVar3);
  pcVar1 = *(code **)(_specialLoc + 0x780);
  dVar4 = glu::ShaderProgram::getProgram
                    ((this->super_FramebufferRenderCase).super_RenderCase.m_program);
  passNdx = (*pcVar1)(dVar4,"a_pos");
  pcVar1 = *(code **)(_specialLoc + 0xb48);
  dVar4 = glu::ShaderProgram::getProgram
                    ((this->super_FramebufferRenderCase).super_RenderCase.m_program);
  uStack_f8 = (*pcVar1)(dVar4,"u_special");
  (**(code **)(_specialLoc + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(_specialLoc + 0x1a00))(0,0,0x100);
  pcVar1 = *(code **)(_specialLoc + 0x1680);
  dVar4 = glu::ShaderProgram::getProgram
                    ((this->super_FramebufferRenderCase).super_RenderCase.m_program);
  (*pcVar1)(dVar4);
  dVar4 = (**(code **)(_specialLoc + 0x800))();
  glu::checkError(dVar4,"pre-draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,0x54c);
  iVar3 = passNdx;
  pcVar1 = *(code **)(_specialLoc + 0x19f0);
  pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_28,0);
  (*pcVar1)(iVar3,4,0x1406,0,0,pvVar5);
  (**(code **)(_specialLoc + 0x610))(passNdx);
  for (local_fc = 0; local_fc < 2; local_fc = local_fc + 1) {
    local_fd = local_fc == 0;
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.
                        super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_280,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<(&local_280,(char (*) [6])"Pass ");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_fc);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,(char (*) [74])
                               ": Drawing stripes with the shader. Setting u_special for each stripe to ("
                       );
    _one = "1.0";
    if ((local_fd & 1) != 0) {
      _one = "special";
    }
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char **)&one);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2c156ab);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_280);
    (**(code **)(_specialLoc + 0x188))(0x4000);
    for (special = 0; (int)special < 0x16; special = special + 1) {
      uniformValue = 0x3f800000;
      indexIndex = *(int *)(Stress::(anonymous_namespace)::s_specialFloats + (long)(int)special * 4)
      ;
      local_a9c = indexIndex;
      if ((local_fd & 1) == 0) {
        local_a9c = 0x3f800000;
      }
      local_298 = local_a9c;
      iVar3 = special * 6;
      (**(code **)(_specialLoc + 0x14e8))(uStack_f8,1,&local_298);
      pcVar1 = *(code **)(_specialLoc + 0x568);
      pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                          &textureFormat.type,(long)iVar3);
      (*pcVar1)(4,6,0x1403,pvVar6);
    }
    (**(code **)(_specialLoc + 0x648))();
    pRVar7 = gles2::Context::getRenderContext
                       ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.
                        m_context);
    if ((local_fd & 1) == 0) {
      local_ab8 = (TextureLevel *)&posY;
    }
    else {
      local_ab8 = (TextureLevel *)&normalImage.m_data.m_cap;
    }
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&errorMask.m_pixels.m_cap,local_ab8);
    glu::readPixels(pRVar7,0,0,(PixelBufferAccess *)&errorMask.m_pixels.m_cap);
  }
  (**(code **)(_specialLoc + 0x518))(passNdx);
  (**(code **)(_specialLoc + 0x1680))(0);
  dVar4 = (**(code **)(_specialLoc + 0x800))();
  glu::checkError(dVar4,"OutputCase::iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,0x56b);
  tcu::Surface::Surface((Surface *)&okPixelColor,0x100,0x100);
  badPixels = (int)tcu::RGBA::red();
  local_2e8 = tcu::RGBA::green();
  local_2ec = 0;
  pTVar8 = tcu::TestContext::getLog
                     ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.
                      super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<((MessageBuilder *)&x,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&x,
                      (char (*) [108])
                      "Checking passes have identical red and blue channels and the green channel is correct in the constant pass."
                     );
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&x);
  greenThreshold = 0.0;
  do {
    iVar3 = tcu::TextureLevel::getHeight((TextureLevel *)&normalImage.m_data.m_cap);
    if (iVar3 <= (int)greenThreshold) {
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.
                          super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_678,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<(&local_678,(char (*) [7])0x2c2d50c);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_2ec);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [19])" invalid pixel(s).");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_678);
      if (local_2ec == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.
                   super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        pTVar8 = tcu::TestContext::getLog
                           ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.
                            super_TestCase.super_TestNode.m_testCtx);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6d8,"Results",&local_6d9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_700,"Result verification",&local_701);
        tcu::LogImageSet::LogImageSet(&local_6b8,&local_6d8,&local_700);
        pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_6b8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7b8,"Image with special green channel",&local_7b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7e0,"Image with special green channel",&local_7e1);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  (&local_810,(TextureLevel *)&normalImage.m_data.m_cap);
        tcu::LogImage::LogImage
                  (&local_798,&local_7b8,&local_7e0,&local_810,QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_798);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8c0,"Image with constant green channel",&local_8c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8e8,"Image with constant green channel",&local_8e9);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_918,(TextureLevel *)&posY);
        tcu::LogImage::LogImage
                  (&local_8a0,&local_8c0,&local_8e8,&local_918,QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_8a0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_9c8,"Error Mask",&local_9c9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_9f0,"Error Mask",&local_9f1);
        tcu::LogImage::LogImage
                  (&local_9a8,&local_9c8,&local_9f0,(Surface *)&okPixelColor,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_9a8);
        tcu::TestLog::operator<<(pTVar8,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
        tcu::LogImage::~LogImage(&local_9a8);
        std::__cxx11::string::~string((string *)&local_9f0);
        std::allocator<char>::~allocator(&local_9f1);
        std::__cxx11::string::~string((string *)&local_9c8);
        std::allocator<char>::~allocator(&local_9c9);
        tcu::LogImage::~LogImage(&local_8a0);
        std::__cxx11::string::~string((string *)&local_8e8);
        std::allocator<char>::~allocator(&local_8e9);
        std::__cxx11::string::~string((string *)&local_8c0);
        std::allocator<char>::~allocator(&local_8c1);
        tcu::LogImage::~LogImage(&local_798);
        std::__cxx11::string::~string((string *)&local_7e0);
        std::allocator<char>::~allocator(&local_7e1);
        std::__cxx11::string::~string((string *)&local_7b8);
        std::allocator<char>::~allocator(&local_7b9);
        tcu::LogImageSet::~LogImageSet(&local_6b8);
        std::__cxx11::string::~string((string *)&local_700);
        std::allocator<char>::~allocator(&local_701);
        std::__cxx11::string::~string((string *)&local_6d8);
        std::allocator<char>::~allocator(&local_6d9);
        tcu::TestContext::setTestResult
                  ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.
                   super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                   "Image comparison failed");
      }
      tcu::Surface::~Surface((Surface *)&okPixelColor);
      tcu::TextureLevel::~TextureLevel((TextureLevel *)&posY);
      tcu::TextureLevel::~TextureLevel((TextureLevel *)&normalImage.m_data.m_cap);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&textureFormat.type);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_28)
      ;
      return;
    }
    for (cNormal.m_data[3] = 0.0; fVar10 = cNormal.m_data[3],
        iVar3 = tcu::TextureLevel::getWidth((TextureLevel *)&normalImage.m_data.m_cap),
        (int)fVar10 < iVar3; cNormal.m_data[3] = (float)((int)cNormal.m_data[3] + 1)) {
      cNormal.m_data[2] = 0.1;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)(cSpecial.m_data + 2),(TextureLevel *)&posY)
      ;
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_48c,(int)(cSpecial.m_data + 2),
                 (int)cNormal.m_data[3],(int)greenThreshold);
      tcu::TextureLevel::getAccess(&local_4f0,(TextureLevel *)&normalImage.m_data.m_cap);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_4c8,(int)&local_4f0,(int)cNormal.m_data[3],
                 (int)greenThreshold);
      fVar10 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_48c);
      fVar11 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_4c8);
      if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
LAB_01b05294:
        local_2ec = local_2ec + 1;
        local_4f4 = badPixels;
        tcu::Surface::setPixel
                  ((Surface *)&okPixelColor,(int)cNormal.m_data[3],(int)greenThreshold,
                   (RGBA)badPixels);
      }
      else {
        fVar10 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_48c);
        fVar11 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_4c8);
        if ((fVar10 != fVar11) ||
           ((NAN(fVar10) || NAN(fVar11) ||
            (fVar10 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_48c), fVar10 < 0.9))))
        goto LAB_01b05294;
        local_4f8 = local_2e8.m_value;
        tcu::Surface::setPixel
                  ((Surface *)&okPixelColor,(int)cNormal.m_data[3],(int)greenThreshold,local_2e8);
      }
    }
    greenThreshold = (float)((int)greenThreshold + 1);
  } while( true );
}

Assistant:

void OutputCase::testFBO (void)
{
	// Create a 1 X [s_specialFloats] grid of tiles (stripes).
	std::vector<tcu::Vec4>	gridVertices	((DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) * 2);
	std::vector<deUint16>	indices			(DE_LENGTH_OF_ARRAY(s_specialFloats) * 6);
	tcu::TextureFormat		textureFormat	(tcu::TextureFormat::RGBA, (m_fboType == FBO_RGBA_FLOAT16) ? (tcu::TextureFormat::FLOAT) : (tcu::TextureFormat::UNORM_INT8));
	tcu::TextureLevel		specialImage	(textureFormat, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::TextureLevel		normalImage		(textureFormat, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// vertices
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats) + 1; ++y)
	{
		const float posY = (float)y / (float)DE_LENGTH_OF_ARRAY(s_specialFloats) * 2.0f - 1.0f; // map from [0, len(s_specialFloats) ] to [-1, 1]

		gridVertices[y * 2 + 0] = tcu::Vec4(-1.0, posY, 0.0f, 1.0f);
		gridVertices[y * 2 + 1] = tcu::Vec4( 1.0, posY, 0.0f, 1.0f);
	}

	// tiles
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats); ++y)
	{
		const int baseNdx = y * 6;

		indices[baseNdx + 0] = (deUint16)((y + 0) * 2);
		indices[baseNdx + 1] = (deUint16)((y + 1) * 2);
		indices[baseNdx + 2] = (deUint16)((y + 1) * 2 + 1);

		indices[baseNdx + 3] = (deUint16)((y + 0) * 2);
		indices[baseNdx + 4] = (deUint16)((y + 1) * 2 + 1);
		indices[baseNdx + 5] = (deUint16)((y + 0) * 2 + 1);
	}

	// Draw grids
	{
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const GLint				positionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_pos");
		const GLint				specialLoc	= gl.getUniformLocation(m_program->getProgram(), "u_special");

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(m_program->getProgram());
		GLU_EXPECT_NO_ERROR(gl.getError(), "pre-draw");

		gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridVertices[0]);
		gl.enableVertexAttribArray(positionLoc);

		// draw 2 passes. Special and normal.
		for (int passNdx = 0; passNdx < 2; ++passNdx)
		{
			const bool specialPass	= (passNdx == 0);

			m_testCtx.getLog() << tcu::TestLog::Message << "Pass " << passNdx << ": Drawing stripes with the shader. Setting u_special for each stripe to (" << ((specialPass) ? ("special") : ("1.0")) << ")." << tcu::TestLog::EndMessage;

			// draw stripes
			gl.clear(GL_COLOR_BUFFER_BIT);
			for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats); ++y)
			{
				const deUint32	one				= 0x3F800000;
				const deUint32	special			= s_specialFloats[y];
				const deUint32	uniformValue	= (specialPass) ? (special) : (one);
				const int		indexIndex		= y * 6;

				gl.uniform1fv(specialLoc, 1, (const float*)&uniformValue);
				gl.drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, &indices[indexIndex]);
			}

			gl.finish();
			glu::readPixels(m_context.getRenderContext(), 0, 0, ((specialPass) ? (specialImage) : (normalImage)).getAccess());
		}

		gl.disableVertexAttribArray(positionLoc);
		gl.useProgram(0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "OutputCase::iterate");
	}

	// Check results
	{
		tcu::Surface		errorMask		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		const tcu::RGBA		badPixelColor	= tcu::RGBA::red();
		const tcu::RGBA		okPixelColor	= tcu::RGBA::green();
		int					badPixels		= 0;

		m_testCtx.getLog() << tcu::TestLog::Message << "Checking passes have identical red and blue channels and the green channel is correct in the constant pass." << tcu::TestLog::EndMessage;

		for (int y = 0; y < specialImage.getHeight(); ++y)
		for (int x = 0; x < specialImage.getWidth(); ++x)
		{
			const float		greenThreshold	= 0.1f;
			const tcu::Vec4	cNormal			= normalImage.getAccess().getPixel(x, y);
			const tcu::Vec4	cSpecial		= specialImage.getAccess().getPixel(x, y);

			if (cNormal.x() != cSpecial.x() || cNormal.z() != cSpecial.z() || cNormal.y() < 1.0f - greenThreshold)
			{
				++badPixels;
				errorMask.setPixel(x, y, badPixelColor);
			}
			else
				errorMask.setPixel(x, y, okPixelColor);
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Found " << badPixels << " invalid pixel(s)." << tcu::TestLog::EndMessage;

		if (badPixels)
		{
			m_testCtx.getLog()
					<< tcu::TestLog::ImageSet("Results", "Result verification")
					<< tcu::TestLog::Image("Image with special green channel",	"Image with special green channel",		specialImage)
					<< tcu::TestLog::Image("Image with constant green channel",	"Image with constant green channel",	normalImage)
					<< tcu::TestLog::Image("Error Mask",						"Error Mask",							errorMask)
					<< tcu::TestLog::EndImageSet;

			// all ok?
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
		}
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
}